

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O3

bool __thiscall
OpenMD::RNEMD::SPFMethod::getSelectedMolecule(SPFMethod *this,shared_ptr<OpenMD::SPFData> *spfData)

{
  int iVar1;
  SimInfo *pSVar2;
  Molecule *this_00;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  RealType RVar6;
  
  pSVar2 = (this->super_RNEMD).info_;
  p_Var4 = (pSVar2->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    iVar1 = ((spfData->super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            globalID;
    p_Var3 = &(pSVar2->molecules_)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var3->_M_header;
    do {
      if (iVar1 <= (int)p_Var4[1]._M_color) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var5 != p_Var3) && ((int)p_Var5[1]._M_color <= iVar1)) &&
       (this_00 = (Molecule *)p_Var5[1]._M_parent, this_00 != (Molecule *)0x0)) {
      if ((this->super_RNEMD).useChargedSPF_ == true) {
        RVar6 = Molecule::getFixedCharge(this_00);
        if (RVar6 < 0.0) {
          this->spfTarget_ = -this->spfTarget_;
        }
        RVar6 = Molecule::getFixedCharge(this_00);
        this->spfTarget_ = this->spfTarget_ / ABS(RVar6);
      }
      SPFForceManager::setSelectedMolecule(this->forceManager_,this_00);
    }
  }
  return true;
}

Assistant:

bool SPFMethod::getSelectedMolecule(std::shared_ptr<SPFData> spfData) {
    Molecule* selectedMolecule;

    selectedMolecule = info_->getMoleculeByGlobalIndex(spfData->globalID);

    if (selectedMolecule) {
      if (useChargedSPF_) {
        if (selectedMolecule->getFixedCharge() < 0.0) { spfTarget_ *= -1; }

        // Scale the particle flux by the charge yielding a current density
        convertParticlesToElectrons(selectedMolecule);
      }

      forceManager_->setSelectedMolecule(selectedMolecule);
    }

    return true;
  }